

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.cpp
# Opt level: O3

shared_ptr<cppnet::Timer> cppnet::MakeTimer1Min(void)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  element_type *in_RDI;
  shared_ptr<cppnet::Timer> sVar2;
  shared_ptr<cppnet::TimerContainer> sec_sub;
  undefined1 local_71;
  TIME_UNIT local_70 [2];
  element_type local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_60;
  element_type *local_58;
  shared_ptr<cppnet::TimerContainer> local_50;
  _func_int **local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  local_68._vptr_Timer = (_func_int **)0x0;
  local_70[1] = 1;
  local_70[0] = TU_SECOND;
  local_50.super___shared_ptr<cppnet::TimerContainer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_58 = in_RDI;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<cppnet::TimerContainer,std::allocator<cppnet::TimerContainer>,decltype(nullptr),cppnet::TIME_UNIT,cppnet::TIME_UNIT>
            (&local_50.super___shared_ptr<cppnet::TimerContainer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(TimerContainer **)&local_50,
             (allocator<cppnet::TimerContainer> *)&local_71,&local_68._vptr_Timer,local_70 + 1,
             local_70);
  local_70[1] = 1000;
  local_70[0] = TU_MINUTE;
  local_68._vptr_Timer = (_func_int **)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<cppnet::TimerContainer,std::allocator<cppnet::TimerContainer>,std::shared_ptr<cppnet::TimerContainer>&,cppnet::TIME_UNIT,cppnet::TIME_UNIT>
            (&_Stack_60,(TimerContainer **)&local_68,(allocator<cppnet::TimerContainer> *)&local_71,
             &local_50,local_70 + 1,local_70);
  local_40 = local_68._vptr_Timer;
  local_38._M_pi = _Stack_60._M_pi;
  if (_Stack_60._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (_Stack_60._M_pi)->_M_use_count = (_Stack_60._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (_Stack_60._M_pi)->_M_use_count = (_Stack_60._M_pi)->_M_use_count + 1;
    }
  }
  ((local_50.super___shared_ptr<cppnet::TimerContainer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  _root_timer).super___weak_ptr<cppnet::TimerContainer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_68._vptr_Timer;
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&((local_50.super___shared_ptr<cppnet::TimerContainer,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->_root_timer).
              super___weak_ptr<cppnet::TimerContainer,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &local_38);
  _Var1._M_pi = extraout_RDX;
  if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
    _Var1._M_pi = extraout_RDX_00;
  }
  local_58->_vptr_Timer = local_68._vptr_Timer;
  local_58[1]._vptr_Timer = (_func_int **)_Stack_60._M_pi;
  if (local_50.super___shared_ptr<cppnet::TimerContainer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_50.super___shared_ptr<cppnet::TimerContainer,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    _Var1._M_pi = extraout_RDX_01;
  }
  sVar2.super___shared_ptr<cppnet::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var1._M_pi;
  sVar2.super___shared_ptr<cppnet::Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_58;
  return (shared_ptr<cppnet::Timer>)
         sVar2.super___shared_ptr<cppnet::Timer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Timer> MakeTimer1Min() {
    auto sec_sub = std::make_shared<TimerContainer>(nullptr, TU_MILLISECOND, TU_SECOND);
    auto timer = std::make_shared<TimerContainer>(sec_sub, TU_SECOND, TU_MINUTE);
    sec_sub->SetRootTimer(timer);
    return timer;
}